

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneralBlockPanelKernel.h
# Opt level: O2

void Eigen::internal::computeProductBlockingSizes<double,double,1,long>(long *k,long *m,long *n)

{
  ulong uVar1;
  long lVar2;
  long local_38;
  ptrdiff_t l1;
  ptrdiff_t l2;
  
  uVar1 = 0;
  manage_caching_sizes(GetAction,&local_38,&l1);
  lVar2 = *k;
  if (local_38 / 0x80 < *k) {
    lVar2 = local_38 / 0x80;
  }
  *k = lVar2;
  if (0 < lVar2) {
    uVar1 = (ulong)l1 / (ulong)(lVar2 << 5);
  }
  if ((long)uVar1 < *m) {
    *m = (ulong)((uint)uVar1 & 0xfffffffc);
  }
  return;
}

Assistant:

void computeProductBlockingSizes(SizeType& k, SizeType& m, SizeType& n)
{
  EIGEN_UNUSED_VARIABLE(n);
  // Explanations:
  // Let's recall the product algorithms form kc x nc horizontal panels B' on the rhs and
  // mc x kc blocks A' on the lhs. A' has to fit into L2 cache. Moreover, B' is processed
  // per kc x nr vertical small panels where nr is the blocking size along the n dimension
  // at the register level. For vectorization purpose, these small vertical panels are unpacked,
  // e.g., each coefficient is replicated to fit a packet. This small vertical panel has to
  // stay in L1 cache.
  std::ptrdiff_t l1, l2;

  typedef gebp_traits<LhsScalar,RhsScalar> Traits;
  enum {
    kdiv = KcFactor * 2 * Traits::nr
         * Traits::RhsProgress * sizeof(RhsScalar),
    mr = gebp_traits<LhsScalar,RhsScalar>::mr,
    mr_mask = (0xffffffff/mr)*mr
  };

  manage_caching_sizes(GetAction, &l1, &l2);
  k = std::min<SizeType>(k, l1/kdiv);
  SizeType _m = k>0 ? l2/(4 * sizeof(LhsScalar) * k) : 0;
  if(_m<m) m = _m & mr_mask;
}